

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_pagehandle.cc
# Opt level: O0

RC __thiscall PF_PageHandle::GetData(PF_PageHandle *this,char **pData)

{
  char **pData_local;
  PF_PageHandle *this_local;
  
  if (this->pPageData == (char *)0x0) {
    this_local._4_4_ = 7;
  }
  else {
    *pData = this->pPageData;
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

RC PF_PageHandle::GetData(char *&pData) const
{
  // Page must refer to a pinned page
  if (pPageData == NULL)
    return (PF_PAGEUNPINNED);

  // Set pData to point to page contents (after PF header)
  pData = pPageData;

  // Return ok
  return (0);
}